

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Architecture.cpp
# Opt level: O1

void __thiscall ArchitectureCommand::writeTempData(ArchitectureCommand *this,TempData *tempData)

{
  istream *piVar1;
  string line;
  stringstream stream;
  string local_1d0;
  stringstream local_1b0 [128];
  ios_base local_130 [264];
  
  if ((this->tempText)._M_string_length != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0,(string *)&this->tempText,_S_out|_S_in);
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_1d0,'\n');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if (local_1d0._M_string_length != 0) {
        TempData::writeLine(tempData,this->position,&local_1d0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                               local_1d0.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void ArchitectureCommand::writeTempData(TempData& tempData) const
{
	if (tempText.size() != 0)
	{
		std::stringstream stream(tempText);

		std::string line;
		while (std::getline(stream,line,'\n'))
		{
			if (line.size() != 0)
				tempData.writeLine(position,line);
		}
	}
}